

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

int Mf_SetAddCut(Mf_Cut_t **pCuts,int nCuts,int nCutNum)

{
  uint uVar1;
  Mf_Cut_t *pMVar2;
  Mf_Cut_t *pMVar3;
  bool bVar4;
  int iVar5;
  Mf_Cut_t *t;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  
  if (nCuts == 0) {
    return 1;
  }
  if (0 < nCuts) {
    uVar6 = 0;
    bVar4 = false;
    do {
      pMVar2 = pCuts[(uint)nCuts];
      uVar7 = *(uint *)&pMVar2->field_0x10 >> 0x1b;
      pMVar3 = pCuts[uVar6];
      uVar1 = *(uint *)&pMVar3->field_0x10;
      uVar11 = uVar1 >> 0x1b;
      if ((uVar7 < uVar11) && ((pMVar2->Sign & ~pMVar3->Sign) == 0)) {
        if (uVar11 == uVar7) {
          if (0x7ffffff < uVar1) {
            uVar8 = 0;
            do {
              if (pMVar3->pLeaves[uVar8] != pMVar2->pLeaves[uVar8]) goto LAB_006e1009;
              uVar8 = uVar8 + 1;
            } while (uVar11 != uVar8);
          }
        }
        else if (0x7ffffff < *(uint *)&pMVar2->field_0x10) {
          uVar8 = 0;
          uVar9 = 0;
          do {
            if (pMVar2->pLeaves[(int)uVar9] < pMVar3->pLeaves[uVar8]) break;
            if ((pMVar3->pLeaves[uVar8] == pMVar2->pLeaves[(int)uVar9]) &&
               (uVar9 = uVar9 + 1, uVar9 == uVar7)) goto LAB_006e0ff8;
            uVar8 = uVar8 + 1;
          } while (uVar11 != uVar8);
          goto LAB_006e1009;
        }
LAB_006e0ff8:
        *(uint *)&pMVar3->field_0x10 = uVar1 | 0xf8000000;
        bVar4 = true;
      }
LAB_006e1009:
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)nCuts);
    if (bVar4) {
      uVar6 = 0;
      iVar5 = 0;
      do {
        if (*(uint *)&pCuts[uVar6]->field_0x10 < 0xf8000000) {
          lVar10 = (long)iVar5;
          if (lVar10 < (long)uVar6) {
            pMVar2 = pCuts[lVar10];
            pCuts[lVar10] = pCuts[uVar6];
            pCuts[uVar6] = pMVar2;
          }
          iVar5 = iVar5 + 1;
        }
        uVar6 = uVar6 + 1;
      } while (nCuts + 1 != uVar6);
      nCuts = iVar5 - 1;
    }
  }
  if (0 < nCuts) {
    lVar10 = (ulong)(uint)nCuts + 1;
    while( true ) {
      pMVar2 = pCuts[lVar10 + -2];
      pMVar3 = pCuts[lVar10 + -1];
      if (pMVar2->Flow < pMVar3->Flow) break;
      if (pMVar2->Flow <= pMVar3->Flow) {
        if ((pMVar2->Delay < pMVar3->Delay) ||
           ((pMVar2->Delay <= pMVar3->Delay &&
            (*(uint *)&pMVar2->field_0x10 >> 0x1b < *(uint *)&pMVar3->field_0x10 >> 0x1b)))) break;
      }
      pCuts[lVar10 + -2] = pMVar3;
      pCuts[lVar10 + -1] = pMVar2;
      lVar10 = lVar10 + -1;
      if (lVar10 < 2) break;
    }
  }
  iVar5 = nCutNum + -1;
  if ((int)(nCuts + 1U) < nCutNum + -1) {
    iVar5 = nCuts + 1U;
  }
  return iVar5;
}

Assistant:

static inline int Mf_SetAddCut( Mf_Cut_t ** pCuts, int nCuts, int nCutNum )
{
    if ( nCuts == 0 )
        return 1;
    nCuts = Mf_SetLastCutContainsArea(pCuts, nCuts);
    Mf_SetSortByArea( pCuts, nCuts );
    return Abc_MinInt( nCuts + 1, nCutNum - 1 );
}